

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

Image * __thiscall sf::Texture::copyToImage(Image *__return_storage_ptr__,Texture *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  pointer __dest;
  pointer __src;
  TransientContextLock lock;
  TextureSaver save;
  vector<unsigned_char,_std::allocator<unsigned_char>_> allPixels;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  TransientContextLock local_6e;
  allocator_type local_6d;
  TextureSaver local_6c;
  Image *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (this->m_texture == 0) {
    Image::Image(__return_storage_ptr__);
  }
  else {
    GlResource::TransientContextLock::TransientContextLock(&local_6e);
    priv::TextureSaver::TextureSaver(&local_6c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_48,(ulong)((this->m_size).x * (this->m_size).y * 4),
               (allocator_type *)&local_60);
    uVar3 = (this->m_actualSize).x;
    if ((((this->m_size).x == uVar3) && ((this->m_size).y == (this->m_actualSize).y)) &&
       (this->m_pixelsFlipped == false)) {
      (*sf_glad_glBindTexture)(0xde1,this->m_texture);
      (*sf_glad_glGetTexImage)
                (0xde1,0,0x1908,0x1401,
                 local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_60,(ulong)(uVar3 * (this->m_actualSize).y * 4),&local_6d);
      local_68 = __return_storage_ptr__;
      (*sf_glad_glBindTexture)(0xde1,this->m_texture);
      (*sf_glad_glGetTexImage)
                (0xde1,0,0x1908,0x1401,
                 local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if ((this->m_size).y != 0) {
        uVar3 = (this->m_actualSize).x;
        iVar2 = uVar3 * 4;
        uVar4 = 0;
        uVar5 = (ulong)(((this->m_size).y - 1) * iVar2);
        iVar1 = uVar3 * -4;
        if (this->m_pixelsFlipped == false) {
          uVar5 = uVar4;
          iVar1 = iVar2;
        }
        __src = local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + uVar5;
        uVar5 = (ulong)((this->m_size).x << 2);
        __dest = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          memcpy(__dest,__src,uVar5);
          __src = __src + iVar1;
          __dest = __dest + uVar5;
          uVar3 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar3;
        } while (uVar3 < (this->m_size).y);
      }
      __return_storage_ptr__ = local_68;
      if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        __return_storage_ptr__ = local_68;
      }
    }
    Image::Image(__return_storage_ptr__);
    Image::create(__return_storage_ptr__,(this->m_size).x,(this->m_size).y,
                  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start);
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (Uint8 *)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    priv::TextureSaver::~TextureSaver(&local_6c);
    GlResource::TransientContextLock::~TransientContextLock(&local_6e);
  }
  return __return_storage_ptr__;
}

Assistant:

Image Texture::copyToImage() const
{
    // Easy case: empty texture
    if (!m_texture)
        return Image();

    TransientContextLock lock;

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    // Create an array of pixels
    std::vector<Uint8> pixels(m_size.x * m_size.y * 4);

#ifdef SFML_OPENGL_ES

    // OpenGL ES doesn't have the glGetTexImage function, the only way to read
    // from a texture is to bind it to a FBO and use glReadPixels
    GLuint frameBuffer = 0;
    glCheck(GLEXT_glGenFramebuffers(1, &frameBuffer));
    if (frameBuffer)
    {
        GLint previousFrameBuffer;
        glCheck(glGetIntegerv(GLEXT_GL_FRAMEBUFFER_BINDING, &previousFrameBuffer));

        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, frameBuffer));
        glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0));
        glCheck(glReadPixels(0,
                             0,
                             static_cast<GLsizei>(m_size.x),
                             static_cast<GLsizei>(m_size.y),
                             GL_RGBA,
                             GL_UNSIGNED_BYTE,
                             &pixels[0]));
        glCheck(GLEXT_glDeleteFramebuffers(1, &frameBuffer));

        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, static_cast<GLuint>(previousFrameBuffer)));

        if (m_pixelsFlipped)
        {
            // Flip the texture vertically
            const int stride        = static_cast<int>(m_size.x * 4);
            Uint8*    currentRowPtr = pixels.data();
            Uint8*    nextRowPtr    = pixels.data() + stride;
            Uint8*    reverseRowPtr = pixels.data() + (stride * static_cast<int>(m_size.y - 1));
            for (unsigned int y = 0; y < m_size.y / 2; ++y)
            {
                std::swap_ranges(currentRowPtr, nextRowPtr, reverseRowPtr);
                currentRowPtr = nextRowPtr;
                nextRowPtr += stride;
                reverseRowPtr -= stride;
            }
        }
    }

#else

    if ((m_size == m_actualSize) && !m_pixelsFlipped)
    {
        // Texture is not padded nor flipped, we can use a direct copy
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_UNSIGNED_BYTE, &pixels[0]));
    }
    else
    {
        // Texture is either padded or flipped, we have to use a slower algorithm

        // All the pixels will first be copied to a temporary array
        std::vector<Uint8> allPixels(m_actualSize.x * m_actualSize.y * 4);
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_UNSIGNED_BYTE, &allPixels[0]));

        // Then we copy the useful pixels from the temporary array to the final one
        const Uint8* src = &allPixels[0];
        Uint8* dst = &pixels[0];
        int srcPitch = static_cast<int>(m_actualSize.x * 4);
        unsigned int dstPitch = m_size.x * 4;

        // Handle the case where source pixels are flipped vertically
        if (m_pixelsFlipped)
        {
            src += static_cast<unsigned int>(srcPitch * static_cast<int>((m_size.y - 1)));
            srcPitch = -srcPitch;
        }

        for (unsigned int i = 0; i < m_size.y; ++i)
        {
            std::memcpy(dst, src, dstPitch);
            src += srcPitch;
            dst += dstPitch;
        }
    }

#endif // SFML_OPENGL_ES

    // Create the image
    Image image;
    image.create(m_size.x, m_size.y, &pixels[0]);

    return image;
}